

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateBlockSize_sequences
                 (BYTE *ofCodeTable,BYTE *llCodeTable,BYTE *mlCodeTable,size_t nbSeq,
                 ZSTD_fseCTables_t *fseTables,ZSTD_fseCTablesMetadata_t *fseMetadata,void *workspace
                 ,size_t wkspSize,int writeEntropy)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long local_48;
  size_t cSeqSizeEstimate;
  size_t sequencesSectionHeaderSize;
  ZSTD_fseCTablesMetadata_t *fseMetadata_local;
  ZSTD_fseCTables_t *fseTables_local;
  size_t nbSeq_local;
  BYTE *mlCodeTable_local;
  BYTE *llCodeTable_local;
  BYTE *ofCodeTable_local;
  
  sVar1 = ZSTD_estimateBlockSize_symbolType
                    (fseMetadata->ofType,ofCodeTable,nbSeq,0x1f,fseTables->offcodeCTable,(U32 *)0x0,
                     OF_defaultNorm,5,0x1c,workspace,wkspSize);
  sVar2 = ZSTD_estimateBlockSize_symbolType
                    (fseMetadata->llType,llCodeTable,nbSeq,0x23,fseTables->litlengthCTable,LL_bits,
                     LL_defaultNorm,6,0x23,workspace,wkspSize);
  sVar3 = ZSTD_estimateBlockSize_symbolType
                    (fseMetadata->mlType,mlCodeTable,nbSeq,0x34,fseTables->matchlengthCTable,ML_bits
                     ,ML_defaultNorm,6,0x34,workspace,wkspSize);
  local_48 = sVar3 + sVar2 + sVar1;
  if (writeEntropy != 0) {
    local_48 = fseMetadata->fseTablesSize + local_48;
  }
  return local_48 + (int)((0x7f < nbSeq) + 2 + (uint)(0x7eff < nbSeq));
}

Assistant:

static size_t ZSTD_estimateBlockSize_sequences(const BYTE* ofCodeTable,
                                                  const BYTE* llCodeTable,
                                                  const BYTE* mlCodeTable,
                                                  size_t nbSeq,
                                                  const ZSTD_fseCTables_t* fseTables,
                                                  const ZSTD_fseCTablesMetadata_t* fseMetadata,
                                                  void* workspace, size_t wkspSize,
                                                  int writeEntropy)
{
    size_t sequencesSectionHeaderSize = 1 /* seqHead */ + 1 /* min seqSize size */ + (nbSeq >= 128) + (nbSeq >= LONGNBSEQ);
    size_t cSeqSizeEstimate = 0;
    cSeqSizeEstimate += ZSTD_estimateBlockSize_symbolType(fseMetadata->ofType, ofCodeTable, nbSeq, MaxOff,
                                         fseTables->offcodeCTable, NULL,
                                         OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                                         workspace, wkspSize);
    cSeqSizeEstimate += ZSTD_estimateBlockSize_symbolType(fseMetadata->llType, llCodeTable, nbSeq, MaxLL,
                                         fseTables->litlengthCTable, LL_bits,
                                         LL_defaultNorm, LL_defaultNormLog, MaxLL,
                                         workspace, wkspSize);
    cSeqSizeEstimate += ZSTD_estimateBlockSize_symbolType(fseMetadata->mlType, mlCodeTable, nbSeq, MaxML,
                                         fseTables->matchlengthCTable, ML_bits,
                                         ML_defaultNorm, ML_defaultNormLog, MaxML,
                                         workspace, wkspSize);
    if (writeEntropy) cSeqSizeEstimate += fseMetadata->fseTablesSize;
    return cSeqSizeEstimate + sequencesSectionHeaderSize;
}